

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall ncnn::Net::load_model(Net *this,DataReader *dr)

{
  pointer ppLVar1;
  pointer ppLVar2;
  Layer *pLVar3;
  int iVar4;
  PoolAllocator *pPVar5;
  uint uVar6;
  Net *this_00;
  long lVar7;
  bool bVar8;
  ModelBinFromDataReader mb;
  Option opt1;
  int local_8c;
  ModelBinFromDataReader local_88;
  undefined4 local_78;
  int iStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  int iStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  ppLVar1 = (this->d->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppLVar2 = (this->d->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar1 == ppLVar2) {
    load_model();
    local_8c = -1;
  }
  else {
    ModelBinFromDataReader::ModelBinFromDataReader(&local_88,dr);
    uVar6 = (uint)((ulong)((long)ppLVar2 - (long)ppLVar1) >> 3);
    if ((int)uVar6 < 1) {
      local_8c = 0;
    }
    else {
      local_8c = 0;
      this_00 = (Net *)0x0;
      do {
        pLVar3 = (this->d->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)this_00];
        if (pLVar3 == (Layer *)0x0) {
          load_model(this_00);
LAB_0016212f:
          local_8c = -1;
          bVar8 = true;
        }
        else {
          iVar4 = (*pLVar3->_vptr_Layer[3])(pLVar3,&local_88);
          if (iVar4 != 0) {
            load_model();
            goto LAB_0016212f;
          }
          if (pLVar3->support_int8_storage == true) {
            (this->opt).use_vulkan_compute = false;
          }
          bVar8 = false;
        }
      } while ((!bVar8) &&
              (bVar8 = (Net *)((ulong)(uVar6 & 0x7fffffff) - 1) != this_00,
              this_00 = (Net *)((long)&this_00->_vptr_Net + 1), bVar8));
    }
    if (0 < (int)uVar6) {
      lVar7 = 0;
      do {
        pLVar3 = (this->d->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar7];
        local_78 = *(undefined4 *)&this->opt;
        iStack_74 = (this->opt).num_threads;
        uStack_70 = *(undefined4 *)&(this->opt).blob_allocator;
        uStack_6c = *(undefined4 *)((long)&(this->opt).blob_allocator + 4);
        local_68 = *(undefined4 *)&(this->opt).workspace_allocator;
        uStack_64 = *(undefined4 *)((long)&(this->opt).workspace_allocator + 4);
        iStack_60 = (this->opt).openmp_blocktime;
        uStack_5c._0_1_ = (this->opt).use_winograd_convolution;
        uStack_5c._1_1_ = (this->opt).use_sgemm_convolution;
        uStack_5c._2_1_ = (this->opt).use_int8_inference;
        uStack_5c._3_1_ = (this->opt).use_vulkan_compute;
        local_58._0_1_ = (this->opt).use_bf16_storage;
        local_58._1_1_ = (this->opt).use_fp16_packed;
        local_58._2_1_ = (this->opt).use_fp16_storage;
        local_58._3_1_ = (this->opt).use_fp16_arithmetic;
        uStack_54._0_1_ = (this->opt).use_int8_packed;
        uStack_54._1_1_ = (this->opt).use_int8_storage;
        uStack_54._2_1_ = (this->opt).use_int8_arithmetic;
        uStack_54._3_1_ = (this->opt).use_packing_layout;
        uStack_50._0_1_ = (this->opt).use_shader_pack8;
        uStack_50._1_1_ = (this->opt).use_subgroup_basic;
        uStack_50._2_1_ = (this->opt).use_subgroup_vote;
        uStack_50._3_1_ = (this->opt).use_subgroup_ballot;
        uStack_4c._0_1_ = (this->opt).use_subgroup_shuffle;
        uStack_4c._1_1_ = (this->opt).use_image_storage;
        uStack_4c._2_1_ = (this->opt).use_tensor_storage;
        uStack_4c._3_1_ = (this->opt).use_weight_fp16_storage;
        local_48 = (this->opt).flush_denormals;
        uStack_44._0_1_ = (this->opt).use_local_pool_allocator;
        uStack_44._1_1_ = (this->opt).use_reserved_1;
        uStack_44._2_1_ = (this->opt).use_reserved_2;
        uStack_44._3_1_ = (this->opt).use_reserved_3;
        uStack_40._0_1_ = (this->opt).use_reserved_4;
        uStack_40._1_1_ = (this->opt).use_reserved_5;
        uStack_40._2_1_ = (this->opt).use_reserved_6;
        uStack_40._3_1_ = (this->opt).use_reserved_7;
        uStack_3c._0_1_ = (this->opt).use_reserved_8;
        uStack_3c._1_1_ = (this->opt).use_reserved_9;
        uStack_3c._2_1_ = (this->opt).use_reserved_10;
        uStack_3c._3_1_ = (this->opt).use_reserved_11;
        iVar4 = (*pLVar3->_vptr_Layer[4])(pLVar3,&local_78);
        if (iVar4 != 0) {
          load_model();
          local_8c = -1;
          break;
        }
        bVar8 = (ulong)(uVar6 & 0x7fffffff) - 1 != lVar7;
        lVar7 = lVar7 + 1;
      } while (bVar8);
    }
    if ((this->opt).use_local_pool_allocator == true) {
      if (((this->opt).blob_allocator == (Allocator *)0x0) &&
         (this->d->local_blob_allocator == (PoolAllocator *)0x0)) {
        pPVar5 = (PoolAllocator *)operator_new(0x10);
        PoolAllocator::PoolAllocator(pPVar5);
        this->d->local_blob_allocator = pPVar5;
        PoolAllocator::set_size_compare_ratio(pPVar5,0.0);
      }
      if (((this->opt).workspace_allocator == (Allocator *)0x0) &&
         (this->d->local_workspace_allocator == (PoolAllocator *)0x0)) {
        pPVar5 = (PoolAllocator *)operator_new(0x10);
        PoolAllocator::PoolAllocator(pPVar5);
        this->d->local_workspace_allocator = pPVar5;
        PoolAllocator::set_size_compare_ratio(pPVar5,0.5);
      }
    }
    ModelBinFromDataReader::~ModelBinFromDataReader(&local_88);
  }
  return local_8c;
}

Assistant:

int Net::load_model(const DataReader& dr)
{
    if (d->layers.empty())
    {
        NCNN_LOGE("network graph not ready");
        return -1;
    }

    int layer_count = (int)d->layers.size();

    // load file
    int ret = 0;

    ModelBinFromDataReader mb(dr);
    for (int i = 0; i < layer_count; i++)
    {
        Layer* layer = d->layers[i];

        //Here we found inconsistent content in the parameter file.
        if (!layer)
        {
            NCNN_LOGE("load_model error at layer %d, parameter file has inconsistent content.", i);
            ret = -1;
            break;
        }

        int lret = layer->load_model(mb);
        if (lret != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("layer load_model %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("layer load_model %d failed", i);
#endif
            ret = -1;
            break;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }
    }

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        if (!opt.pipeline_cache)
        {
            if (!d->pipeline_cache)
                d->pipeline_cache = new PipelineCache(d->vkdev);
            opt.pipeline_cache = d->pipeline_cache;
        }
    }
#endif // NCNN_VULKAN

    for (int i = 0; i < layer_count; i++)
    {
        Layer* layer = d->layers[i];

        Option opt1 = opt;
#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
        {
            if (!layer->support_image_storage) opt1.use_image_storage = false;
        }
#endif // NCNN_VULKAN

        int cret = layer->create_pipeline(opt1);
        if (cret != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("layer create_pipeline %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("layer create_pipeline %d failed", i);
#endif
            ret = -1;
            break;
        }
    }

    if (opt.use_local_pool_allocator)
    {
        if (opt.blob_allocator == 0)
        {
            if (!d->local_blob_allocator)
            {
                d->local_blob_allocator = new PoolAllocator;
                d->local_blob_allocator->set_size_compare_ratio(0.f);
            }
        }
        if (opt.workspace_allocator == 0)
        {
            if (!d->local_workspace_allocator)
            {
                d->local_workspace_allocator = new PoolAllocator;
                d->local_workspace_allocator->set_size_compare_ratio(0.5f);
            }
        }
    }

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        d->upload_model();
    }
#endif // NCNN_VULKAN

    return ret;
}